

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_> *
mathiu::impl::coeffAndTerm
          (pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
           *__return_storage_ptr__,Expr *e)

{
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *this;
  Product *v;
  _Base_ptr p_Var1;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Var2;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  IdProcess IVar7;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __tmp_1;
  variant_alternative_t<1UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value;
  variant_alternative_t<3UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_00;
  variant_alternative_t<4UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_01;
  variant_alternative_t<5UL,_variant<monostate,_const_Product_*,_Subrange<_Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>,__Rb_tree_const_iterator<pair<const_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_>_>,_shared_ptr<const_Expr>,_const_int_*,_const_Fraction_*,_bool>_>
  *value_02;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_> *pIVar8;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar9;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar10;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *__x;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>_&>
  pIVar11;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *p_Var12;
  shared_ptr<const_mathiu::impl::Expr> *__a;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar14;
  _Atomic_word *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  undefined **ppuVar16;
  undefined1 **ppuVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  byte bVar20;
  ContextT context;
  Product pCopy;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> icoeff;
  Id<mathiu::impl::Product> ip;
  undefined1 auStack_930 [8];
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_928;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *local_920;
  undefined1 local_918 [88];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_8c0;
  undefined8 local_898 [11];
  size_t local_840;
  anon_class_1_0_00000001 *local_830;
  InternalPatternT<bool> IStack_828;
  undefined7 uStack_827;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_820;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_818;
  element_type *local_7d0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_7c8;
  undefined8 local_7a0 [13];
  undefined1 local_738 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  _Stack_730;
  undefined8 local_708 [14];
  undefined1 local_698 [40];
  _Atomic_word local_670 [8];
  element_type *local_650;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_648;
  undefined8 local_620 [13];
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_5b8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_590;
  element_type *local_548;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_540;
  undefined8 local_518 [13];
  undefined1 local_4b0 [64];
  __index_type local_470;
  undefined8 local_468;
  undefined1 auStack_460 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  _Stack_458;
  undefined1 *local_410;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_408;
  undefined8 local_3e0 [4];
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_3c0 [2];
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_398;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_388;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_378;
  variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *local_368;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_360;
  undefined1 *local_358;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_350;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_348;
  undefined1 *local_300;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_2f8;
  undefined8 local_2d0 [13];
  anon_class_1_0_00000001 *local_268;
  InternalPatternT<bool> IStack_260;
  undefined7 uStack_25f;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_258;
  undefined1 *local_230;
  undefined8 local_228 [10];
  undefined1 *local_1d8;
  undefined1 local_1d0;
  undefined1 *local_1c8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_1c0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_1b8;
  undefined1 *local_170;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_168;
  undefined8 local_140 [13];
  anon_class_1_0_00000001 *local_d8;
  InternalPatternT<bool> IStack_d0;
  undefined7 uStack_cf;
  element_type *local_c8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_c0;
  undefined8 local_98 [13];
  
  bVar20 = 0;
  local_928 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)e;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5b8);
  local_468 = (undefined1 *)((ulong)local_468._4_4_ << 0x20);
  auStack_460 = (undefined1  [8])0x0;
  _Stack_458._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  _Stack_458._M_u._8_8_ = 0;
  _Stack_458._M_u._16_8_ = 0;
  _Stack_458._M_u._24_8_ = 0;
  _Stack_458._M_u._32_8_ = 0;
  _Stack_458._M_u._40_8_ = 0;
  local_4b0._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                     *)(local_4b0 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                     *)auStack_460);
  local_470 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                       *)auStack_460);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_258,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5b8);
  local_230 = &matchit::impl::deref;
  ppuVar16 = &PTR_asPointer<mathiu::impl::Fraction>_0025b088;
  puVar18 = local_228;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar18 = *ppuVar16;
    ppuVar16 = ppuVar16 + (ulong)bVar20 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
  }
  local_1d8 = &matchit::impl::cast<bool>;
  local_1d0 = 1;
  local_c8 = (element_type *)(auStack_930 + 7);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_c0,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_258);
  ppuVar17 = &local_230;
  puVar18 = local_98;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar18 = *ppuVar17;
    ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
  }
  local_738 = (undefined1  [8])local_c8;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&_Stack_730,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_c0);
  puVar18 = local_98;
  puVar19 = local_708;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_590._M_first,(Id<mathiu::impl::Product> *)local_4b0
            );
  local_548 = (element_type *)local_738;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_540,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&_Stack_730);
  puVar18 = local_708;
  puVar19 = local_518;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)local_698,(Id<mathiu::impl::Product> *)&local_590._M_first
            );
  local_650 = local_548;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_648,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_540);
  puVar18 = local_518;
  puVar19 = local_620;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              &matchit::impl::deref;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_818._M_first,(Id<mathiu::impl::Product> *)local_698
            );
  local_7d0 = local_650;
  local_920 = __return_storage_ptr__;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7c8,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_648);
  puVar18 = local_620;
  puVar19 = local_7a0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  this = (_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
          *)(local_918 + 8);
  local_918._0_8_ = local_820;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)this,(Id<mathiu::impl::Product> *)&local_818._M_first);
  local_918._80_8_ = local_7d0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_8c0,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7c8);
  puVar18 = local_7a0;
  puVar19 = local_898;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  local_830 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_828 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_7c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_818._M_first);
  local_1c8 = &matchit::impl::asPointer<mathiu::impl::Product>;
  _Stack_1c0 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
               local_918._0_8_;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_1b8,(Id<mathiu::impl::Product> *)this);
  local_170 = (undefined1 *)local_918._80_8_;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_168,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_8c0);
  puVar18 = local_898;
  puVar19 = local_140;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  uStack_cf = uStack_827;
  IStack_d0 = IStack_828;
  local_d8 = local_830;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_8c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(this);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_648);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_698);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_540);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_590._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&_Stack_730);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_258);
  local_358 = local_1c8;
  _Stack_350 = _Stack_1c0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_348,(Id<mathiu::impl::Product> *)&local_1b8);
  local_300 = local_170;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_2f8,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_168);
  puVar18 = local_140;
  puVar19 = local_2d0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  local_268 = local_d8;
  IStack_260 = IStack_d0;
  uStack_25f = uStack_cf;
  local_468 = local_358;
  auStack_460 = (undefined1  [8])_Stack_350;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&_Stack_458,(Id<mathiu::impl::Product> *)&local_348);
  local_410 = local_300;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_2f8);
  puVar18 = local_2d0;
  puVar19 = local_3e0;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *puVar19 = *puVar18;
    puVar18 = puVar18 + (ulong)bVar20 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
  }
  local_378.mUnary = local_268;
  local_378.mPattern = IStack_260;
  local_378._9_7_ = uStack_25f;
  _Stack_730._M_u._8_8_ = (element_type *)0x0;
  _Stack_730._M_u._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_738 = (undefined1  [8])0x0;
  _Stack_730._M_u._M_rest =
       (_Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>)0x0;
  local_368 = (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
               *)local_4b0;
  local_360 = &local_5b8;
  memset(local_918,0,0xe0);
  lVar14 = 0x10;
  do {
    local_918[lVar14] = 0;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0xe8);
  local_840 = 0;
  local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  if (*(char *)&((_Base_ptr)((long)local_928 + 0x20))->_M_right == '\b') {
    local_820 = local_928;
  }
  std::
  variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
  ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
               *)local_918,(Product **)&local_820);
  lVar14 = local_840 * 0x18;
  local_840 = local_840 + 1;
  value = std::
          get<1ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                      *)(local_918 + lVar14));
  bVar6 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                    (value,&local_378,2,
                     (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                      *)local_918);
  if (!bVar6) {
    IVar7 = kCANCEL;
    goto LAB_00184799;
  }
  v = *value;
  if ((v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar8 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_820._M_first,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_408)->
              super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
LAB_0018474b:
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,4);
LAB_00184758:
    IVar7 = kCANCEL;
  }
  else {
    p_Var1 = (v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
                p_Var1[1]._M_left;
    local_818._M_rest =
         (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)p_Var1[1]._M_right;
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)local_818._M_rest + 8) = *(int *)((long)local_818._M_rest + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)local_818._M_rest + 8) = *(int *)((long)local_818._M_rest + 8) + 1;
      }
    }
    std::
    variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
    ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                 *)(local_918 + local_840 * 0x18),
                (shared_ptr<const_mathiu::impl::Expr> *)&local_820._M_first);
    local_840 = local_840 + 1;
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._M_rest);
    }
    value_00 = std::
               get<3ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(auStack_930 + local_840 * 0x18));
    bVar6 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_00,&local_388,8,
                       (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                        *)local_918);
    if (!bVar6) {
LAB_00184701:
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,6);
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar8,5);
      pIVar8 = &std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)&local_408)->
                super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
      goto LAB_0018474b;
    }
    _Var2 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
            (value_00->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
    if (*(char *)&((_Base_ptr)((long)_Var2 + 0x20))->_M_right == '\0') {
      local_820 = _Var2;
    }
    std::
    variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
    ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                 *)(local_918 + local_840 * 0x18),(int **)&local_820);
    lVar14 = local_840 * 0x18;
    local_840 = local_840 + 1;
    value_01 = std::
               get<4ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                         ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(local_918 + lVar14));
    bVar6 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<int_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                      (value_01,&local_398,0xc,
                       (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                        *)local_918);
    if (!bVar6) {
      local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
      if (*(char *)&((_Base_ptr)((long)_Var2 + 0x20))->_M_right == '\x01') {
        local_820 = _Var2;
      }
      std::
      variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
      ::operator=((variant<std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                   *)(local_918 + local_840 * 0x18),(Fraction **)&local_820);
      lVar14 = local_840 * 0x18;
      local_840 = local_840 + 1;
      value_02 = std::
                 get<5ul,std::monostate,mathiu::impl::Product_const*,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,int_const*,mathiu::impl::Fraction_const*,bool>
                           ((variant<std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                             *)(local_918 + lVar14));
      bVar6 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Fraction_const*&,matchit::impl::Context<mathiu::impl::Product_const*,bool,matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::shared_ptr<mathiu::impl::Expr_const>,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool>>
                        (value_02,local_3c0,0xc,
                         (Context<const_mathiu::impl::Product_*,_bool,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool>
                          *)local_918);
      if (!bVar6) goto LAB_00184701;
    }
    bVar6 = matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::
            matchValue<std::shared_ptr<mathiu::impl::Expr_const>>
                      ((Id<std::shared_ptr<mathiu::impl::Expr_const>> *)&local_408,value_00);
    IVar7 = (IdProcess)bVar6;
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,7,IVar7);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,6,(uint)bVar6);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,5,IVar7);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,4,IVar7);
    if (!bVar6) goto LAB_00184758;
    bVar6 = matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
                      ((Id<mathiu::impl::Product> *)&_Stack_458,v);
    IVar7 = (IdProcess)bVar6;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&_Stack_458,4,(uint)bVar6);
  }
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,3,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,3,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,2,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,2,IVar7);
LAB_00184799:
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,1,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,1,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_408,0,IVar7);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&_Stack_458,0,IVar7);
  if (IVar7 != kCANCEL) {
    pIVar9 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_820._M_first,local_368);
    pPVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_820._M_first,
                         &(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant);
    if ((pPVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count < 3) {
      pIVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_820._M_first,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)local_360);
      __a = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
              ::_S_vtable._M_arr
              [*(__index_type *)
                ((long)&(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                        mVariant.
                        super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                        .
                        super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                + 0x10)]._M_data)
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                        *)&local_820,
                       &(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                        mVariant);
      pIVar9 = std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_820._M_first,local_368);
      pPVar10 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_820._M_first,
                           &(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant);
      lVar14 = std::_Rb_tree_decrement
                         (&(pPVar10->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header)
      ;
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
                ((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                  *)&local_590._M_first,__a,(shared_ptr<const_mathiu::impl::Expr> *)(lVar14 + 0x30))
      ;
    }
    else {
      pIVar9 = std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                           *)local_698,local_368);
      __x = (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
             *)std::
               visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                           *)local_698,&(pIVar9->super_IdBlockBase<mathiu::impl::Product>).mVariant)
      ;
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&local_820._M_first,__x);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                      *)&local_820._M_first,(const_iterator)local_818._16_8_);
      pIVar11 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                            *)local_698,
                           (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                            *)local_360);
      p_Var12 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *)
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
                  ::_S_vtable._M_arr
                  [*(__index_type *)
                    ((long)&(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>)
                            .mVariant.
                            super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                            .
                            super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                    + 0x10)]._M_data)
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                            *)local_698,
                           &(pIVar11->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>)
                            .mVariant);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)local_698,
                 (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  *)&local_820._M_first);
      local_590._24_8_ = operator_new(0x50);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._24_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._24_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._24_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
      p_Var15 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x10))->
                 _M_use_count;
      if ((_func_int **)local_698._16_8_ == (_func_int **)0x0) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x10))->_M_use_count =
             0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)0x0;
        *(_Atomic_word **)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x20))->_M_use_count
             = p_Var15;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x30))->
        _vptr__Sp_counted_base = (_func_int **)p_Var15;
        p_Var15 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x30))->
                   _M_use_count;
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x10))->_M_use_count =
             local_698._8_4_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x20))->
        _vptr__Sp_counted_base = (_func_int **)local_698._16_8_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x20))->_M_use_count =
             local_698._24_4_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x20))->_M_weak_count =
             local_698._28_4_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x30))->
        _vptr__Sp_counted_base = (_func_int **)local_698._32_8_;
        *(_Atomic_word **)(local_698._16_8_ + 8) = p_Var15;
        p_Var15 = local_670;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x30))->_M_use_count =
             local_670[0];
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x30))->_M_weak_count =
             local_670[1];
        local_698._16_8_ = (_func_int **)0x0;
        local_698._24_8_ = local_698 + 8;
        local_698._32_8_ = local_698 + 8;
      }
      *(undefined8 *)p_Var15 = 0;
      *(undefined1 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_590._24_8_ + 0x40))->_M_use_count =
           8;
      local_590._16_8_ = local_590._24_8_ + 0x10;
      local_590._M_rest = *p_Var12;
      local_590._8_8_ = *(undefined8 *)&p_Var12[1]._M_rest;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)local_698);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                   *)&local_820._M_first);
    }
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)local_738,(type)&local_590._M_first);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_590._8_8_);
    }
  }
  lVar14 = 0xc0;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                         *)(local_918 + lVar14));
    ppVar3 = local_920;
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if (IVar7 == kCANCEL) {
    memset(local_918,0,0xe0);
    lVar14 = 0x10;
    do {
      local_918[lVar14] = 0;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0xe8);
    local_840 = 0;
    _Var13 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)operator_new(0x50);
    *(_Base_ptr *)((long)_Var13 + 8) = (_Base_ptr)0x100000001;
    *(undefined ***)_Var13 = &PTR___Sp_counted_ptr_inplace_00253718;
    *(undefined4 *)((long)_Var13 + 0x10) = 1;
    *(undefined1 *)((long)_Var13 + 0x48) = 0;
    local_698._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Expr_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_698 + 8),(Expr **)local_698,
               (allocator<mathiu::impl::Expr> *)&local_590,(Expr *)local_928);
    local_820 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
                ((long)_Var13 + 0x10);
    local_818._16_8_ = CONCAT44(local_698._12_4_,local_698._8_4_);
    local_818._8_8_ = local_698._0_8_;
    local_818._M_rest = _Var13;
    std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::operator=((pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 *)local_738,(type)&local_820._M_first);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._16_8_);
    }
    if (local_818._M_rest != (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0)
    {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._M_rest);
    }
    lVar14 = 0xc0;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_const_mathiu::impl::Product_*,_matchit::impl::Subrange<std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::shared_ptr<const_mathiu::impl::Expr>,_const_int_*,_const_mathiu::impl::Fraction_*,_bool>
                           *)(local_918 + lVar14));
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != -0x18);
  }
  uVar5 = _Stack_730._M_u._16_8_;
  uVar4 = _Stack_730._M_u._M_rest;
  (ppVar3->first).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_738;
  (ppVar3->first).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_730._M_u._M_rest =
       (_Variadic_union<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>)0x0;
  (ppVar3->first).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  local_738 = (undefined1  [8])0x0;
  (ppVar3->second).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Stack_730._M_u._8_8_;
  (ppVar3->second).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_730._M_u._16_8_ = 0;
  (ppVar3->second).super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_408);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&_Stack_458);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_2f8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_348);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_168);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_1b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_4b0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_5b8);
  return ppVar3;
}

Assistant:

std::pair<ExprPtr, ExprPtr> coeffAndTerm(Expr const &e)
    {
        constexpr auto firstIsCoeff = [](auto &&id, auto &&whole)
        {
            constexpr auto asCoeff = or_(as<Integer>(_), as<Fraction>(_));
            constexpr auto second = [](auto &&p)
            {
                return p.second;
            };
            // second part of the first pair
            return as<Product>(whole.at(ds(app(second, id.at(some(asCoeff))), ooo)));
        };

        Id<ExprPtr> icoeff;
        Id<Product> ip;
        return match(e)(
            pattern | firstIsCoeff(icoeff, ip) = [&]
            {
                if ((*ip).size() > 2)
                {
                    auto pCopy = *ip;
                    pCopy.erase(pCopy.begin());
                    return std::make_pair(*icoeff, makeSharedExprPtr(Product{pCopy}));
                }
                // single value left.
                // the basic unary transformation.
                return std::make_pair(*icoeff, (*(*ip).rbegin()).second);
            },
            pattern | _ = [&]
            { return std::make_pair(1_i, makeSharedExprPtr(e)); });
    }